

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definition.cpp
# Opt level: O2

string * __thiscall
huelang::DefinitionTable::GetName_abi_cxx11_
          (string *__return_storage_ptr__,DefinitionTable *this,Word word)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (this->buckets[word._0_8_ & 0xffff].
              super__Vector_base<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>
              ._M_impl.super__Vector_impl_data._M_start + word.minor));
  return __return_storage_ptr__;
}

Assistant:

string DefinitionTable::GetName(Word word) {
        return buckets[word.major][word.minor].name;
    }